

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemdelegate.cpp
# Opt level: O0

QWidget * __thiscall
QItemDelegate::createEditor
          (QItemDelegate *this,QWidget *parent,QStyleOptionViewItem *param_3,QModelIndex *index)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  QItemDelegatePrivate *pQVar4;
  undefined4 extraout_var;
  undefined8 in_RSI;
  long in_FS_OFFSET;
  QWidget *w;
  QItemEditorFactory *factory;
  QItemDelegatePrivate *d;
  FocusPolicy in_stack_ffffffffffffff7c;
  QWidget *in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff90;
  QModelIndex *in_stack_ffffffffffffff98;
  QItemEditorFactory *local_60;
  QWidget *local_30;
  QVariant local_28;
  long local_8;
  
  iVar3 = (int)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = d_func((QItemDelegate *)0x853d0a);
  bVar1 = QModelIndex::isValid((QModelIndex *)in_stack_ffffffffffffff80);
  if (bVar1) {
    local_60 = pQVar4->f;
    if (local_60 == (QItemEditorFactory *)0x0) {
      local_60 = QItemEditorFactory::defaultFactory();
    }
    QModelIndex::data(in_stack_ffffffffffffff98,iVar3);
    uVar2 = ::QVariant::userType((QVariant *)0x853d73);
    iVar3 = (*local_60->_vptr_QItemEditorFactory[2])(local_60,(ulong)uVar2,in_RSI);
    local_30 = (QWidget *)CONCAT44(extraout_var,iVar3);
    ::QVariant::~QVariant(&local_28);
    if (local_30 != (QWidget *)0x0) {
      QWidget::setFocusPolicy(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    }
  }
  else {
    local_30 = (QWidget *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_30;
}

Assistant:

QWidget *QItemDelegate::createEditor(QWidget *parent,
                                     const QStyleOptionViewItem &,
                                     const QModelIndex &index) const
{
    Q_D(const QItemDelegate);
    if (!index.isValid())
        return nullptr;
    const QItemEditorFactory *factory = d->f;
    if (factory == nullptr)
        factory = QItemEditorFactory::defaultFactory();
    QWidget *w = factory->createEditor(index.data(Qt::EditRole).userType(), parent);
    if (w)
        w->setFocusPolicy(Qt::WheelFocus);
    return w;
}